

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_min_s_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  bVar4 = *(byte *)((long)pfVar1 + 1);
  bVar5 = *(byte *)((long)pfVar1 + 2);
  bVar6 = *(byte *)((long)pfVar1 + 3);
  bVar7 = *(byte *)((long)pfVar1 + 4);
  bVar8 = *(byte *)((long)pfVar1 + 5);
  bVar9 = *(byte *)((long)pfVar1 + 6);
  bVar10 = *(byte *)((long)pfVar1 + 7);
  bVar11 = *(byte *)((long)pfVar1 + 8);
  bVar12 = *(byte *)((long)pfVar1 + 9);
  bVar13 = *(byte *)((long)pfVar1 + 10);
  bVar14 = *(byte *)((long)pfVar1 + 0xb);
  bVar15 = *(byte *)((long)pfVar1 + 0xc);
  bVar16 = *(byte *)((long)pfVar1 + 0xd);
  bVar17 = *(byte *)((long)pfVar1 + 0xe);
  bVar18 = *(byte *)((long)pfVar1 + 0xf);
  pfVar2 = (env->active_fpu).fpr + wt;
  bVar19 = *(byte *)((long)pfVar2 + 1);
  bVar20 = *(byte *)((long)pfVar2 + 2);
  bVar21 = *(byte *)((long)pfVar2 + 3);
  bVar22 = *(byte *)((long)pfVar2 + 4);
  bVar23 = *(byte *)((long)pfVar2 + 5);
  bVar24 = *(byte *)((long)pfVar2 + 6);
  bVar25 = *(byte *)((long)pfVar2 + 7);
  bVar26 = *(byte *)((long)pfVar2 + 8);
  bVar27 = *(byte *)((long)pfVar2 + 9);
  bVar28 = *(byte *)((long)pfVar2 + 10);
  bVar29 = *(byte *)((long)pfVar2 + 0xb);
  bVar30 = *(byte *)((long)pfVar2 + 0xc);
  bVar31 = *(byte *)((long)pfVar2 + 0xd);
  bVar32 = *(byte *)((long)pfVar2 + 0xe);
  bVar33 = *(byte *)((long)pfVar2 + 0xf);
  bVar34 = -((char)*(byte *)pfVar1 < (char)*(byte *)pfVar2);
  bVar35 = -((char)bVar4 < (char)bVar19);
  bVar36 = -((char)bVar5 < (char)bVar20);
  bVar37 = -((char)bVar6 < (char)bVar21);
  bVar38 = -((char)bVar7 < (char)bVar22);
  bVar39 = -((char)bVar8 < (char)bVar23);
  bVar40 = -((char)bVar9 < (char)bVar24);
  bVar41 = -((char)bVar10 < (char)bVar25);
  bVar42 = -((char)bVar11 < (char)bVar26);
  bVar43 = -((char)bVar12 < (char)bVar27);
  bVar44 = -((char)bVar13 < (char)bVar28);
  bVar45 = -((char)bVar14 < (char)bVar29);
  bVar46 = -((char)bVar15 < (char)bVar30);
  bVar47 = -((char)bVar16 < (char)bVar31);
  bVar48 = -((char)bVar17 < (char)bVar32);
  bVar49 = -((char)bVar18 < (char)bVar33);
  pfVar3 = (env->active_fpu).fpr + wd;
  *(byte *)pfVar3 = ~bVar34 & *(byte *)pfVar2 | *(byte *)pfVar1 & bVar34;
  *(byte *)((long)pfVar3 + 1) = ~bVar35 & bVar19 | bVar4 & bVar35;
  *(byte *)((long)pfVar3 + 2) = ~bVar36 & bVar20 | bVar5 & bVar36;
  *(byte *)((long)pfVar3 + 3) = ~bVar37 & bVar21 | bVar6 & bVar37;
  *(byte *)((long)pfVar3 + 4) = ~bVar38 & bVar22 | bVar7 & bVar38;
  *(byte *)((long)pfVar3 + 5) = ~bVar39 & bVar23 | bVar8 & bVar39;
  *(byte *)((long)pfVar3 + 6) = ~bVar40 & bVar24 | bVar9 & bVar40;
  *(byte *)((long)pfVar3 + 7) = ~bVar41 & bVar25 | bVar10 & bVar41;
  *(byte *)((long)pfVar3 + 8) = ~bVar42 & bVar26 | bVar11 & bVar42;
  *(byte *)((long)pfVar3 + 9) = ~bVar43 & bVar27 | bVar12 & bVar43;
  *(byte *)((long)pfVar3 + 10) = ~bVar44 & bVar28 | bVar13 & bVar44;
  *(byte *)((long)pfVar3 + 0xb) = ~bVar45 & bVar29 | bVar14 & bVar45;
  *(byte *)((long)pfVar3 + 0xc) = ~bVar46 & bVar30 | bVar15 & bVar46;
  *(byte *)((long)pfVar3 + 0xd) = ~bVar47 & bVar31 | bVar16 & bVar47;
  *(byte *)((long)pfVar3 + 0xe) = ~bVar48 & bVar32 | bVar17 & bVar48;
  *(byte *)((long)pfVar3 + 0xf) = ~bVar49 & bVar33 | bVar18 & bVar49;
  return;
}

Assistant:

void helper_msa_min_s_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_min_s_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_min_s_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_min_s_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_min_s_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_min_s_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_min_s_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_min_s_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_min_s_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_min_s_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_min_s_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_min_s_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_min_s_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_min_s_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_min_s_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_min_s_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_min_s_df(DF_BYTE, pws->b[15], pwt->b[15]);
}